

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O3

void zzSqr(word *b,word *a,size_t n,void *stack)

{
  ulong *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  word *pwVar14;
  ulong uVar15;
  word *pwVar16;
  size_t sVar17;
  word wVar18;
  long lVar19;
  ulong *puVar20;
  undefined1 auVar21 [16];
  
  sVar17 = n * 2;
  wwSetZero(b,sVar17);
  if (n != 0) {
    pwVar14 = b;
    pwVar16 = a;
    uVar15 = 0;
    do {
      uVar13 = uVar15 + 1;
      if (uVar13 < n) {
        lVar19 = 1;
        wVar18 = 0;
        do {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = wVar18;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pwVar16[lVar19];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = a[uVar15];
          auVar8 = auVar3 * auVar5 + auVar8;
          uVar10 = auVar8._0_8_;
          puVar20 = pwVar14 + lVar19;
          uVar11 = *puVar20;
          *puVar20 = *puVar20 + uVar10;
          wVar18 = auVar8._8_8_ + (ulong)CARRY8(uVar11,uVar10);
          lVar2 = uVar15 + lVar19;
          lVar19 = lVar19 + 1;
          uVar11 = n;
        } while (lVar2 + 1U < n);
      }
      else {
        wVar18 = 0;
        uVar11 = uVar13;
      }
      b[uVar15 + uVar11] = wVar18;
      pwVar16 = pwVar16 + 1;
      pwVar14 = pwVar14 + 2;
      uVar15 = uVar13;
    } while (uVar13 != n);
    if (sVar17 == 0) {
      uVar15 = 0;
    }
    else {
      sVar12 = 0;
      uVar15 = 0;
      do {
        auVar3 = *(undefined1 (*) [16])(b + sVar12);
        auVar21._8_8_ = auVar3._8_8_ * 2;
        auVar21._0_8_ = auVar3._0_8_ * 2;
        auVar7._8_4_ = -(auVar3._4_4_ >> 0x1f);
        auVar7._0_8_ = uVar15;
        auVar7._12_4_ = 0;
        *(undefined1 (*) [16])(b + sVar12) = auVar21 | auVar7;
        sVar12 = sVar12 + 2;
        uVar15 = auVar3._8_8_ >> 0x3f;
      } while (sVar17 != sVar12);
      uVar15 = (ulong)(uint)-(auVar3._12_4_ >> 0x1f);
    }
    if (n != 0) {
      puVar20 = b + 1;
      sVar17 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar15;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = a[sVar17];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = a[sVar17];
        auVar9 = auVar4 * auVar6 + auVar9;
        uVar13 = auVar9._0_8_;
        puVar1 = puVar20 + -1;
        uVar15 = *puVar1;
        *puVar1 = *puVar1 + uVar13;
        uVar13 = auVar9._8_8_ + (ulong)CARRY8(uVar15,uVar13);
        uVar15 = *puVar20;
        *puVar20 = *puVar20 + uVar13;
        uVar15 = (ulong)CARRY8(uVar15,uVar13);
        sVar17 = sVar17 + 1;
        puVar20 = puVar20 + 2;
      } while (n != sVar17);
    }
  }
  return;
}

Assistant:

void zzSqr(word b[], const word a[], size_t n, void* stack)
{
	register word carry = 0;
	register word carry1;
	register dword prod;
	size_t i, j;
	ASSERT(wwIsDisjoint2(a, n, b, n + n));
	// b <- \sum_{i < j} a_i a_j B^{i + j}
	wwSetZero(b, n + n);
	for (i = 0; i < n; ++i)
	{
		for (j = i + 1; j < n; ++j)
		{
			zzMul11(prod, a[i], a[j]);
			prod += carry;
			prod += b[i + j];
			b[i + j] = (word)prod;
			carry = (word)(prod >> B_PER_W);
		}
		b[i + j] = carry;
		carry = 0;
	}
	// b <- 2 b
	for (i = 0; i < n + n; ++i)
	{
		carry1 = b[i] >> (B_PER_W - 1);
		b[i] = (b[i] << 1) | carry;
		carry = carry1;
	}
	// b <- b + \sum_i a_i^2 B^{i + i}
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, a[i], a[i]);
		prod += carry;
		prod += b[i + i];
		b[i + i] = (word)prod;
		prod >>= B_PER_W;
		prod += b[i + i + 1];
		b[i + i + 1] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0;
	carry = carry1 = 0;
}